

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O1

void CheckColumns(TidyDocImpl *doc,Node *node)

{
  int *piVar1;
  char cVar2;
  Dict *pDVar3;
  bool bVar4;
  Bool BVar5;
  ctmbstr ptVar6;
  Node *pNVar7;
  ctmbstr cp;
  int iVar8;
  
  piVar1 = &(doc->access).CheckedHeaders;
  *piVar1 = *piVar1 + 1;
  iVar8 = 0;
  if (((node->content == (Node *)0x0) || (pDVar3 = node->content->tag, pDVar3 == (Dict *)0x0)) ||
     (pDVar3->id != TidyTag_TH)) {
    bVar4 = false;
  }
  else {
    (doc->access).HasTH = yes;
    pNVar7 = node->content;
    bVar4 = false;
    iVar8 = 0;
    if (pNVar7 != (Node *)0x0) {
      bVar4 = false;
      iVar8 = 0;
      do {
        if ((pNVar7->tag == (Dict *)0x0) || (pNVar7->tag->id != TidyTag_TH)) {
          bVar4 = true;
        }
        else {
          BVar5 = prvTidynodeIsText(pNVar7->content);
          if (BVar5 != no) {
            ptVar6 = textFromOneNode(doc,pNVar7->content);
            do {
              cVar2 = *ptVar6;
              if (cVar2 == '\0') break;
              BVar5 = prvTidyIsWhite((int)cVar2);
              ptVar6 = ptVar6 + 1;
            } while (BVar5 != no);
            iVar8 = (iVar8 + 1) - (uint)(cVar2 == '\0');
          }
        }
        pNVar7 = pNVar7->next;
      } while (pNVar7 != (Node *)0x0);
    }
  }
  if ((!bVar4) && (0 < iVar8)) {
    (doc->access).HasValidColumnHeaders = yes;
  }
  if ((bVar4) && (1 < iVar8)) {
    (doc->access).HasInvalidColumnHeader = yes;
  }
  return;
}

Assistant:

static void CheckColumns( TidyDocImpl* doc, Node* node )
{
    Node* tnode;
    int numTH = 0;
    Bool isMissingHeader = no;

    doc->access.CheckedHeaders++;

    /* Table must have row of headers if headers for columns don't exist */
    if ( nodeIsTH(node->content) )
    {
        doc->access.HasTH = yes;

        for ( tnode = node->content; tnode; tnode = tnode->next )
        {
            if ( nodeIsTH(tnode) )
            {
                if ( TY_(nodeIsText)(tnode->content) )
                {
                    ctmbstr word = textFromOneNode( doc, tnode->content);
                    if ( !IsWhitespace(word) )
                        numTH++;
                }
            }
            else
            {
                isMissingHeader = yes;
            }
        }
    }

    if ( !isMissingHeader && numTH > 0 )
        doc->access.HasValidColumnHeaders = yes;

    if ( isMissingHeader && numTH >= 2 )
        doc->access.HasInvalidColumnHeader = yes;
}